

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_relative_location_path
          (xpath_parser *this,xpath_ast_node *set)

{
  lexeme_t lVar1;
  char_t *in_R9;
  lexeme_t l;
  xpath_ast_node *local_38;
  
  local_38 = parse_step(this,set);
  if (local_38 == (xpath_ast_node *)0x0) {
    local_38 = (xpath_ast_node *)0x0;
  }
  else {
    while (lVar1 = (this->_lexer)._cur_lexeme, (lVar1 & ~lex_equal) == lex_slash) {
      xpath_lexer::next(&this->_lexer);
      if ((lVar1 == lex_double_slash) &&
         (local_38 = alloc_node(this,(ast_type_t)local_38,(xpath_ast_node *)0x5,axis_attribute,
                                nodetest_none,in_R9), local_38 == (xpath_ast_node *)0x0)) {
        return (xpath_ast_node *)0x0;
      }
      local_38 = parse_step(this,local_38);
      if (local_38 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
    }
  }
  return local_38;
}

Assistant:

xpath_ast_node* parse_relative_location_path(xpath_ast_node* set)
		{
			xpath_ast_node* n = parse_step(set);
			if (!n) return 0;

			while (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
			{
				lexeme_t l = _lexer.current();
				_lexer.next();

				if (l == lex_double_slash)
				{
					n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
					if (!n) return 0;
				}

				n = parse_step(n);
				if (!n) return 0;
			}

			return n;
		}